

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

word If_Dec6Perform(word t,int fDerive)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  word wVar8;
  word wVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int v;
  word local_e0;
  int Cof1 [2];
  int Cof0_1 [2];
  int Cof0;
  uint local_a4;
  int aiStack_a0 [4];
  ulong local_90;
  int Pla2Var [6];
  int Var2Pla [6];
  int local_48 [6];
  
  for (lVar12 = 0; iVar7 = (int)lVar12, lVar12 != 6; lVar12 = lVar12 + 1) {
    iVar1 = If_Dec6HasVar(t,iVar7);
    if (iVar1 == 0) {
      __assert_fail("If_Dec6HasVar( t, i )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                    ,0x1ab,"word If_Dec6Perform(word, int)");
    }
    Var2Pla[lVar12] = iVar7;
    Pla2Var[lVar12] = iVar7;
  }
  uVar14 = 0;
  iVar7 = 5;
  wVar9 = 0;
  local_e0 = t;
  iVar1 = 0;
  do {
    if (iVar1 == 6) {
      if ((int)uVar14 == 0xf) {
        return wVar9;
      }
      __assert_fail("i == 15",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                    ,0x1c9,"word If_Dec6Perform(word, int)");
    }
    uVar2 = iVar7 + (int)uVar14;
    v = iVar1 + 1;
    while( true ) {
      if ((uint)uVar14 == uVar2) break;
      wVar8 = If_Dec6MoveTo(local_e0,iVar1,0,Pla2Var,Var2Pla);
      local_e0 = If_Dec6MoveTo(wVar8,v,1,Pla2Var,Var2Pla);
      iVar3 = If_Dec6CofCount2(local_e0);
      if (iVar3 < 2) {
        __assert_fail("Count > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                      ,0x1b7,"word If_Dec6Perform(word, int)");
      }
      if (iVar3 == 2) {
        if (fDerive != 0) {
          iVar7 = If_Dec6DeriveCount2(local_e0,&Cof0,local_48);
          uVar14 = (ulong)iVar7;
          for (lVar12 = 0x10; lVar12 != 0x20; lVar12 = lVar12 + 4) {
            uVar14 = uVar14 | (long)*(int *)((long)Pla2Var + lVar12 + -8) << ((byte)lVar12 & 0x3f);
          }
          lVar12 = (long)(local_48[0] << 4 | Cof0);
          return uVar14 | 0x700000000000000 |
                 (ulong)(uint)Pla2Var[0] << 0x30 | lVar12 << 0x28 |
                 lVar12 << 0x20 | (ulong)(uint)Pla2Var[1] << 0x34;
        }
        return 1;
      }
      if (wVar9 == 0) {
        if (iVar3 - 3U < 2) {
          iVar11 = 0;
          lVar12 = 3;
          local_90 = uVar14;
          for (iVar3 = -2; iVar3 != -6; iVar3 = iVar3 + -1) {
            wVar9 = If_Dec6Cofactor(local_e0,iVar11 + 2,0);
            wVar8 = If_Dec6Cofactor(local_e0,iVar11 + 2,1);
            iVar4 = If_Dec6CofCount2(wVar9);
            if ((iVar4 < 3) && (iVar4 = If_Dec6CofCount2(wVar8), uVar14 = local_90, iVar4 < 3)) {
              wVar9 = 1;
              if (fDerive != 0) {
                for (lVar10 = 0; wVar9 = local_e0, lVar10 != 6; lVar10 = lVar10 + 1) {
                  (&Cof0)[lVar10] = Pla2Var[lVar10];
                  local_48[lVar10] = Var2Pla[lVar10];
                }
                for (; lVar12 != 6; lVar12 = lVar12 + 1) {
                  wVar9 = If_Dec6SwapAdjacent(wVar9,(int)lVar12 + -1);
                  iVar3 = Cof0_1[lVar12 + 1];
                  local_48[iVar3] = local_48[iVar3] + 1;
                  iVar11 = (&Cof0)[lVar12];
                  local_48[iVar11] = local_48[iVar11] + -1;
                  (&Cof0)[lVar12] = iVar3;
                  Cof0_1[lVar12 + 1] = iVar11;
                }
                wVar8 = (wVar9 & 0xffffffff) * 0x100000001;
                iVar3 = If_Dec6CofCount2(wVar8);
                if (2 < iVar3) {
                  __assert_fail("2 >= If_Dec6CofCount2(c0)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                                ,0x16b,"word If_Dec6DeriveNonDisjoint(word, int, int *, int *)");
                }
                uVar13 = wVar9 >> 0x20 | wVar9 & 0xffffffff00000000;
                iVar3 = If_Dec6CofCount2(uVar13);
                if (2 < iVar3) {
                  __assert_fail("2 >= If_Dec6CofCount2(c1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                                ,0x16c,"word If_Dec6DeriveNonDisjoint(word, int, int *, int *)");
                }
                uVar5 = If_Dec6DeriveCount2(wVar8,Cof0_1,Cof0_1 + 1);
                uVar6 = If_Dec6DeriveCount2(uVar13,Cof1,Cof1 + 1);
                uVar13 = (ulong)(uVar5 & 0xff | (uVar6 & 0xff) << 8);
                for (lVar12 = 0x10; lVar12 != 0x20; lVar12 = lVar12 + 4) {
                  uVar13 = uVar13 | (long)*(int *)((long)Cof0_1 + lVar12) << ((byte)lVar12 & 0x3f);
                }
                wVar9 = (ulong)(uint)aiStack_a0[3] << 0x3c | uVar13 | 0x700000000000000 |
                        (ulong)(uint)Cof0 << 0x30 | (ulong)(uint)(Cof1[1] << 4 | Cof1[0]) << 0x28 |
                        (ulong)(uint)(Cof0_1[1] << 4 | Cof0_1[0]) << 0x20 | (ulong)local_a4 << 0x34;
              }
              goto LAB_0037b4e1;
            }
            iVar11 = iVar11 + 1;
            lVar12 = lVar12 + 1;
          }
          wVar9 = 0;
          uVar14 = local_90;
        }
        else {
          wVar9 = 0;
        }
      }
LAB_0037b4e1:
      v = v + 1;
      uVar14 = (ulong)((int)uVar14 + 1);
    }
    iVar7 = iVar7 + -1;
    uVar14 = (ulong)uVar2;
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

word If_Dec6Perform( word t, int fDerive )
{ 
    word r = 0;
    int i, v, u, x, Count, Pla2Var[6], Var2Pla[6];
    // start arrays
    for ( i = 0; i < 6; i++ )
    {
        assert( If_Dec6HasVar( t, i ) );
        Pla2Var[i] = Var2Pla[i] = i;
    }
    // generate permutations
    i = 0;
    for ( v = 0;   v < 6; v++ )
    for ( u = v+1; u < 6; u++, i++ )
    {
        t = If_Dec6MoveTo( t, v, 0, Pla2Var, Var2Pla );
        t = If_Dec6MoveTo( t, u, 1, Pla2Var, Var2Pla );
//        If_DecVerifyPerm( Pla2Var, Var2Pla );
        Count = If_Dec6CofCount2( t );
        assert( Count > 1 );
        if ( Count == 2 )
            return !fDerive ? 1 : If_Dec6DeriveDisjoint( t, Pla2Var, Var2Pla );
        // check non-disjoint decomposition
        if ( !r && (Count == 3 || Count == 4) )
        {
            for ( x = 0; x < 4; x++ )
            {
                word c0 = If_Dec6Cofactor( t, x+2, 0 );
                word c1 = If_Dec6Cofactor( t, x+2, 1 );
                if ( If_Dec6CofCount2( c0 ) <= 2 && If_Dec6CofCount2( c1 ) <= 2 )
                {
                    r = !fDerive ? 1 : If_Dec6DeriveNonDisjoint( t, x+2, Pla2Var, Var2Pla );
                    break;
                }
            }
        }
    }
    assert( i == 15 );
    return r;
}